

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void disas_fp_imm(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx;
  uint64_t val;
  TCGv_i64 v;
  int size;
  uintptr_t o;
  
  if ((insn & 0xe00003e0) == 0) {
    tcg_ctx = s->uc->tcg_ctx;
    switch(insn >> 0x16 & 3) {
    case 0:
      size = 2;
      break;
    case 1:
      size = 3;
      break;
    case 2:
      goto switchD_006a2ce9_caseD_2;
    case 3:
      size = 1;
      if ((s->isar->id_aa64pfr0 & 0xf0000) != 0x10000) goto switchD_006a2ce9_caseD_2;
    }
    if (s->fp_access_checked == true) {
      __assert_fail("!s->fp_access_checked",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                    ,0x487,"_Bool fp_access_check(DisasContext *)");
    }
    s->fp_access_checked = true;
    if (s->fp_excp_el == 0) {
      val = vfp_expand_imm_aarch64(size,(uint8_t)(insn >> 0xd));
      v = tcg_const_i64_aarch64(tcg_ctx,val);
      write_fp_dreg_aarch64(s,insn & 0x1f,v);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(v + (long)tcg_ctx));
      return;
    }
    gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
    return;
  }
switchD_006a2ce9_caseD_2:
  unallocated_encoding_aarch64(s);
  return;
}

Assistant:

static void disas_fp_imm(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rd = extract32(insn, 0, 5);
    int imm5 = extract32(insn, 5, 5);
    int imm8 = extract32(insn, 13, 8);
    int type = extract32(insn, 22, 2);
    int mos = extract32(insn, 29, 3);
    uint64_t imm;
    TCGv_i64 tcg_res;
    MemOp sz;

    if (mos || imm5) {
        unallocated_encoding(s);
        return;
    }

    switch (type) {
    case 0:
        sz = MO_32;
        break;
    case 1:
        sz = MO_64;
        break;
    case 3:
        sz = MO_16;
        if (dc_isar_feature(aa64_fp16, s)) {
            break;
        }
        /* fallthru */
    default:
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    imm = vfp_expand_imm(sz, imm8);

    tcg_res = tcg_const_i64(tcg_ctx, imm);
    write_fp_dreg(s, rd, tcg_res);
    tcg_temp_free_i64(tcg_ctx, tcg_res);
}